

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datahashtable.h
# Opt level: O1

char * __thiscall
soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::index
          (DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *this,char *__s,int __c)

{
  pointer pEVar1;
  char *__s2;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  if (this->m_used != 0) {
    iVar3 = (*this->m_hashfun)((Name *)__s);
    pEVar1 = (this->m_elem).data.
             super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar6 = (int)((ulong)((long)(this->m_elem).data.
                                super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1) >> 3) *
            -0x55555555;
    uVar2 = (long)iVar3 % (long)iVar6;
    iVar5 = (int)uVar2;
    __s2 = *(char **)__s;
    iVar3 = this->m_hashsize;
    do {
      iVar7 = (int)uVar2;
      if (*(states *)((long)(pEVar1 + iVar7) + 0x10) == USED) {
        iVar4 = strcmp(pEVar1[iVar7].item.name,__s2);
        if (iVar4 == 0) {
          return (char *)(uVar2 & 0xffffffff);
        }
      }
      else if (*(states *)((long)(pEVar1 + iVar7) + 0x10) == FREE) {
        return (char *)0xffffffff;
      }
      uVar2 = (long)(iVar7 + iVar3) % (long)iVar6;
    } while ((int)uVar2 != iVar5);
  }
  return (char *)0xffffffff;
}

Assistant:

int index(const HashItem& h) const
   {
      if(m_used == 0)
         return -1;

      assert(m_elem.size() > 0);

      auto i = (*m_hashfun)(&h) % m_elem.size();
      auto j = i;

      while(m_elem[i].stat != Elem::FREE)
      {
         if((m_elem[i].stat == Elem::USED)
               && (m_elem[i].item == h))
            return i;

         i = (i + m_hashsize) % m_elem.size();

         if(i == j)
            break;
      }

      return -1;
   }